

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionDAGChecker.cxx
# Opt level: O2

Result __thiscall cmGeneratorExpressionDAGChecker::CheckGraph(cmGeneratorExpressionDAGChecker *this)

{
  __type _Var1;
  cmGeneratorExpressionDAGChecker *pcVar2;
  
  pcVar2 = this;
  do {
    pcVar2 = pcVar2->Parent;
    if (pcVar2 == (cmGeneratorExpressionDAGChecker *)0x0) {
      return DAG;
    }
    _Var1 = std::operator==(&this->Target,&pcVar2->Target);
  } while ((!_Var1) || (_Var1 = std::operator==(&this->Property,&pcVar2->Property), !_Var1));
  return (pcVar2 != this->Parent) + SELF_REFERENCE;
}

Assistant:

cmGeneratorExpressionDAGChecker::Result
cmGeneratorExpressionDAGChecker::CheckGraph() const
{
  const cmGeneratorExpressionDAGChecker* parent = this->Parent;
  while (parent) {
    if (this->Target == parent->Target && this->Property == parent->Property) {
      return (parent == this->Parent) ? SELF_REFERENCE : CYCLIC_REFERENCE;
    }
    parent = parent->Parent;
  }
  return DAG;
}